

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall BenevolentBotStrategy::fortifyToCountryIndex(BenevolentBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_00;
  reference ppCVar1;
  ulong uVar2;
  int i;
  ulong __n;
  int iVar3;
  
  iVar3 = 9999;
  uVar2 = 0;
  for (__n = 0; this_00 = ((this->super_PlayerStrategy).from)->pAdjCountries,
      __n < (ulong)((long)(this_00->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    ppCVar1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(this_00,__n);
    if (*(*ppCVar1)->pNumberOfTroops < iVar3) {
      ppCVar1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (((this->super_PlayerStrategy).from)->pAdjCountries,__n);
      iVar3 = *(*ppCVar1)->pNumberOfTroops;
      ppCVar1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          (((this->super_PlayerStrategy).from)->pAdjCountries,__n);
      (this->super_PlayerStrategy).to = *ppCVar1;
      uVar2 = __n & 0xffffffff;
    }
  }
  return (int)uVar2;
}

Assistant:

int BenevolentBotStrategy::fortifyToCountryIndex() {
    int toCountry = 0;
    int numTroops = 9999;

    for(int i = 0; i < from->getAdjCountries()->size(); i++){
        if(from->getAdjCountries()->at(i)->getNumberOfTroops() < numTroops){
            toCountry = i;
            numTroops = from->getAdjCountries()->at(i)->getNumberOfTroops();
            to = from->getAdjCountries()->at(i);
        }
    }
    return toCountry;
}